

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptGeneratorFunction.cpp
# Opt level: O3

void __thiscall
Js::JavascriptGeneratorFunction::CreateSnapObjectInfo
          (JavascriptGeneratorFunction *this,SlabAllocator *alloc,SnapGeneratorFunctionInfo **info,
          TTD_PTR_ID **depArray,uint32 *depCount)

{
  GeneratorVirtualScriptFunction *pGVar1;
  bool bVar2;
  SnapGeneratorFunctionInfo *pSVar3;
  TTD_PTR_ID *pTVar4;
  
  pSVar3 = (SnapGeneratorFunctionInfo *)
           TTD::SlabAllocatorBase<0>::SlabAllocateTypeRawSize<16ul>(alloc);
  *info = pSVar3;
  pGVar1 = (this->scriptFunction).ptr;
  pSVar3->scriptFunction = (TTD_PTR_ID)pGVar1;
  bVar2 = (bool)(**(code **)((long)(pGVar1->super_ScriptFunction).super_ScriptFunctionBase.
                                   super_JavascriptFunction.super_DynamicObject.
                                   super_RecyclableObject.super_FinalizableObject.
                                   super_IRecyclerVisitedObject + 0x3b8))();
  (*info)->isAnonymousFunction = bVar2;
  *depCount = 0;
  *depArray = (TTD_PTR_ID *)0x0;
  pGVar1 = (this->scriptFunction).ptr;
  if (pGVar1 != (GeneratorVirtualScriptFunction *)0x0) {
    bVar2 = TTD::JsSupport::IsVarComplexKind(pGVar1);
    if (bVar2) {
      pTVar4 = (TTD_PTR_ID *)TTD::SlabAllocatorBase<0>::SlabAllocateRawSize<true,false>(alloc,8);
      *depArray = pTVar4;
      pTVar4[*depCount] = (TTD_PTR_ID)(this->scriptFunction).ptr;
      *depCount = 1;
      TTD::SlabAllocatorBase<0>::SlabCommitArraySpace<unsigned_long>(alloc,1,1);
      return;
    }
  }
  return;
}

Assistant:

void JavascriptGeneratorFunction::CreateSnapObjectInfo(TTD::SlabAllocator& alloc, _Out_ TTD::NSSnapObjects::SnapGeneratorFunctionInfo** info, _Out_ TTD_PTR_ID** depArray, _Out_ uint32* depCount)
    {
        *info = alloc.SlabAllocateStruct<TTD::NSSnapObjects::SnapGeneratorFunctionInfo>();
        (*info)->scriptFunction = TTD_CONVERT_VAR_TO_PTR_ID(this->scriptFunction);
        (*info)->isAnonymousFunction = this->scriptFunction->IsAnonymousFunction();

        *depCount = 0;
        *depArray = nullptr;
        if (this->scriptFunction != nullptr &&  TTD::JsSupport::IsVarComplexKind(this->scriptFunction))
        {
            *depArray = alloc.SlabReserveArraySpace<TTD_PTR_ID>(1);
            (*depArray)[*depCount] = TTD_CONVERT_VAR_TO_PTR_ID(this->scriptFunction);
            *depCount = 1;
            alloc.SlabCommitArraySpace<TTD_PTR_ID>(*depCount, 1);
        }
    }